

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O3

CScript * BuildScript<opcodetype,opcodetype,opcodetype,CScript&,opcodetype>
                    (CScript *__return_storage_ptr__,opcodetype *inputs,opcodetype *inputs_1,
                    opcodetype *inputs_2,CScript *inputs_3,opcodetype *inputs_4)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  CScript *pCVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  CScript::operator<<(__return_storage_ptr__,*inputs);
  CScript::operator<<(__return_storage_ptr__,*inputs_1);
  CScript::operator<<(__return_storage_ptr__,*inputs_2);
  uVar2 = (__return_storage_ptr__->super_CScriptBase)._size;
  uVar3 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar3 = uVar2;
  }
  pCVar4 = (CScript *)(__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    pCVar4 = __return_storage_ptr__;
  }
  uVar2 = (inputs_3->super_CScriptBase)._size;
  if (0x1c < uVar2) {
    inputs_3 = (CScript *)(inputs_3->super_CScriptBase)._union.indirect_contents.indirect;
    uVar2 = uVar2 - 0x1d;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  insert<prevector<28U,_unsigned_char,_unsigned_int,_int>::iterator>
            (&__return_storage_ptr__->super_CScriptBase,
             (uchar *)((long)&(pCVar4->super_CScriptBase)._union + (long)(int)uVar3),
             (iterator)inputs_3,(uchar *)((long)inputs_3 + (long)(int)uVar2));
  CScript::operator<<(__return_storage_ptr__,*inputs_4);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}